

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O3

void __thiscall ymfm::opll_registers::opll_registers(opll_registers *this)

{
  uint8_t *puVar1;
  uint16_t uVar2;
  int iVar3;
  uint32_t index_1;
  ulong uVar4;
  ushort uVar5;
  uint16_t uVar6;
  uint32_t index;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  long lVar9;
  
  this->m_lfo_am_counter = 0;
  this->m_lfo_pm_counter = 0;
  this->m_noise_lfsr = 1;
  this->m_lfo_am = '\0';
  iVar3 = 0;
  uVar5 = 0;
  lVar7 = 0;
  do {
    this->m_waveform[0][lVar7] =
         uVar5 & 0x8000 |
         *(ushort *)
          (abs_sin_attenuation(unsigned_int)::s_sin_table +
          (ulong)(((uint)lVar7 ^ iVar3 >> 0x1f) & 0xff) * 2);
    lVar7 = lVar7 + 1;
    uVar5 = uVar5 + 0x40;
    iVar3 = iVar3 + 0x800000;
  } while (lVar7 != 0x400);
  uVar2 = this->m_waveform[0][0];
  uVar4 = 0;
  do {
    uVar6 = uVar2;
    if (uVar4 < 0x200) {
      uVar6 = this->m_waveform[0][uVar4];
    }
    this->m_waveform[1][uVar4] = uVar6;
    auVar10 = _DAT_001a83d0;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x400);
  puVar1 = this->m_regdata;
  lVar7 = 3;
  auVar8 = _DAT_001a83c0;
  do {
    if (SUB164(auVar8 ^ auVar10,4) == -0x80000000 && SUB164(auVar8 ^ auVar10,0) < -0x7ffffff7) {
      this->m_chinst[lVar7 + -3] = puVar1;
      this->m_chinst[lVar7 + -2] = puVar1;
    }
    lVar9 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 2;
    auVar8._8_8_ = lVar9 + 2;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 0xd);
  uVar4 = 1;
  lVar7 = 0xb;
  auVar10._8_4_ = (int)puVar1;
  auVar10._0_8_ = puVar1;
  auVar10._12_4_ = (int)((ulong)puVar1 >> 0x20);
  do {
    this->m_chinst[lVar7 + -2] = puVar1;
    (this->m_chinst + lVar7 + -2)[1] = (uint8_t *)((uVar4 & 1) + auVar10._8_8_);
    uVar4 = uVar4 + 2;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 0x1d);
  return;
}

Assistant:

opll_registers::opll_registers() :
	m_lfo_am_counter(0),
	m_lfo_pm_counter(0),
	m_noise_lfsr(1),
	m_lfo_am(0)
{
	// create the waveforms
	for (uint32_t index = 0; index < WAVEFORM_LENGTH; index++)
		m_waveform[0][index] = abs_sin_attenuation(index) | (bitfield(index, 9) << 15);

	uint16_t zeroval = m_waveform[0][0];
	for (uint32_t index = 0; index < WAVEFORM_LENGTH; index++)
		m_waveform[1][index] = bitfield(index, 9) ? zeroval : m_waveform[0][index];

	// initialize the instruments to something sane
	for (uint32_t choffs = 0; choffs < CHANNELS; choffs++)
		m_chinst[choffs] = &m_regdata[0];
	for (uint32_t opoffs = 0; opoffs < OPERATORS; opoffs++)
		m_opinst[opoffs] = &m_regdata[bitfield(opoffs, 0)];
}